

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_conv_2d_dw(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  void *pvVar8;
  void *pvVar9;
  undefined1 (*pauVar10) [64];
  undefined1 auVar11 [16];
  char cVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  undefined1 (*pauVar18) [64];
  undefined1 (*pauVar19) [64];
  int64_t knl_y;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  long lVar25;
  void *pvVar26;
  long lVar27;
  int64_t knl_x;
  long lVar28;
  ulong uVar29;
  undefined1 (*pauVar30) [64];
  long lVar31;
  long lVar32;
  undefined8 uVar33;
  long lVar34;
  long lVar35;
  undefined1 (*pauVar36) [64];
  long lVar37;
  long lVar38;
  int64_t knl_y_1;
  undefined1 (*pauVar39) [64];
  undefined1 (*pauVar40) [64];
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  ulong uVar45;
  float sum;
  undefined1 auVar46 [64];
  long local_150;
  undefined1 (*local_f8) [64];
  undefined1 (*local_f0) [64];
  
  pgVar1 = dst->src[1];
  pgVar2 = dst->src[0];
  lVar3 = pgVar1->ne[2];
  if (pgVar2->ne[3] == lVar3) {
    lVar44 = pgVar1->ne[3];
    if (dst->ne[3] == lVar44) {
      uVar4 = dst->ne[0];
      lVar5 = pgVar1->ne[1];
      uVar6 = dst->ne[1];
      lVar7 = pgVar1->ne[0];
      lVar28 = (long)dst->op_params[3];
      lVar41 = (long)dst->op_params[4];
      lVar42 = (long)dst->op_params[5];
      uVar15 = pgVar2->ne[0];
      uVar16 = pgVar2->ne[1];
      lVar13 = (long)dst->op_params[2];
      lVar25 = (long)dst->op_params[0];
      lVar20 = (long)dst->op_params[1];
      cVar12 = ggml_is_contiguous(pgVar1);
      if (cVar12 == '\0') {
        cVar12 = ggml_is_contiguous_channels(pgVar1);
        if (cVar12 == '\0') {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                     ,0x185b,"non-contiguous memory layout not supported");
        }
        if ((pgVar2->nb[0] < pgVar2->nb[2]) || (pgVar2->nb[1] < pgVar2->nb[0])) {
          pcVar24 = "kernel->nb[0] >= kernel->nb[2] && kernel->nb[1] >= kernel->nb[0]";
          uVar33 = 0x1858;
          goto LAB_0013ed03;
        }
        lVar44 = lVar44 * uVar6;
        pauVar10 = (undefined1 (*) [64])pgVar2->data;
        lVar14 = (lVar44 + -1 + (long)params->nth) / (long)params->nth;
        lVar21 = params->ith * lVar14;
        lVar14 = lVar14 + lVar21;
        if (lVar44 <= lVar14) {
          lVar14 = lVar44;
        }
        lVar44 = lVar3 / 0x10;
        lVar38 = uVar15 * lVar3 * 4;
        lVar37 = lVar3 * lVar25 * 4;
        lVar35 = lVar7 * lVar3 * lVar42 * 4;
        uVar15 = ~((long)uVar15 >> 0x3f) & uVar15;
        uVar16 = ~((long)uVar16 >> 0x3f) & uVar16;
        lVar34 = lVar3 * lVar41 * 4;
        for (; lVar21 < lVar14; lVar21 = lVar21 + 1) {
          lVar43 = (lVar21 % (long)uVar6) * lVar20 - lVar28;
          local_f0 = (undefined1 (*) [64])
                     (((lVar20 * 4 * (lVar21 % (long)uVar6) + lVar28 * -4 +
                       (lVar21 / (long)uVar6) * lVar5 * 4) * lVar7 + lVar13 * -4) * lVar3 +
                     (long)pgVar1->data);
          local_f8 = local_f0 + lVar44;
          local_150 = -lVar13;
          for (uVar45 = 0; uVar45 != (~((long)uVar4 >> 0x3f) & uVar4); uVar45 = uVar45 + 1) {
            lVar31 = (uVar45 + lVar21 * uVar4) * lVar3;
            pvVar8 = dst->data;
            pauVar19 = local_f0;
            pauVar40 = pauVar10;
            for (lVar32 = 0; lVar27 = lVar44 << 4, pauVar30 = local_f8, pauVar39 = pauVar10 + lVar44
                , lVar32 < lVar44 << 4; lVar32 = lVar32 + 0x10) {
              auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
              pauVar30 = pauVar19;
              pauVar39 = pauVar40;
              for (uVar23 = 0; uVar23 != uVar16; uVar23 = uVar23 + 1) {
                lVar17 = uVar23 * lVar42 + lVar43;
                pauVar18 = pauVar30;
                lVar27 = local_150;
                pauVar36 = pauVar39;
                uVar22 = uVar15;
                if (lVar17 < lVar5 && -1 < lVar17) {
                  while (uVar22 != 0) {
                    if (lVar27 < lVar7 && -1 < lVar27) {
                      auVar46 = vfmadd231ps_avx512f(auVar46,*pauVar36,*pauVar18);
                    }
                    pauVar18 = (undefined1 (*) [64])(*pauVar18 + lVar34);
                    lVar27 = lVar27 + lVar41;
                    pauVar36 = (undefined1 (*) [64])(*pauVar36 + lVar3 * 4);
                    uVar22 = uVar22 - 1;
                  }
                }
                pauVar39 = (undefined1 (*) [64])(*pauVar39 + lVar38);
                pauVar30 = (undefined1 (*) [64])(*pauVar30 + lVar35);
              }
              *(undefined1 (*) [64])((long)pvVar8 + lVar32 * 4 + lVar31 * 4) = auVar46;
              pauVar40 = pauVar40 + 1;
              pauVar19 = pauVar19 + 1;
            }
            for (; lVar27 < lVar3; lVar27 = lVar27 + 1) {
              auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
              pauVar19 = pauVar30;
              pauVar40 = pauVar39;
              for (uVar23 = 0; uVar23 != uVar16; uVar23 = uVar23 + 1) {
                lVar17 = uVar23 * lVar42 + lVar43;
                pauVar18 = pauVar19;
                lVar32 = local_150;
                uVar22 = uVar15;
                pauVar36 = pauVar40;
                if (lVar17 < lVar5 && -1 < lVar17) {
                  while (uVar22 != 0) {
                    if (lVar32 < lVar7 && -1 < lVar32) {
                      auVar11 = vfmadd231ss_fma(auVar46._0_16_,ZEXT416(*(uint *)*pauVar36),
                                                ZEXT416(*(uint *)*pauVar18));
                      auVar46 = ZEXT1664(auVar11);
                    }
                    pauVar18 = (undefined1 (*) [64])(*pauVar18 + lVar34);
                    lVar32 = lVar32 + lVar41;
                    uVar22 = uVar22 - 1;
                    pauVar36 = (undefined1 (*) [64])(*pauVar36 + lVar3 * 4);
                  }
                }
                pauVar40 = (undefined1 (*) [64])(*pauVar40 + lVar38);
                pauVar19 = (undefined1 (*) [64])(*pauVar19 + lVar35);
              }
              *(int *)((long)pvVar8 + lVar27 * 4 + lVar31 * 4) = auVar46._0_4_;
              pauVar30 = (undefined1 (*) [64])(*pauVar30 + 4);
              pauVar39 = (undefined1 (*) [64])(*pauVar39 + 4);
            }
            local_150 = local_150 + lVar25;
            local_f0 = (undefined1 (*) [64])(*local_f0 + lVar37);
            local_f8 = (undefined1 (*) [64])(*local_f8 + lVar37);
          }
        }
      }
      else {
        lVar44 = lVar44 * lVar3;
        lVar14 = (lVar44 + -1 + (long)params->nth) / (long)params->nth;
        lVar21 = params->ith * lVar14;
        lVar14 = lVar14 + lVar21;
        if (lVar44 <= lVar14) {
          lVar14 = lVar44;
        }
        lVar44 = (lVar21 * lVar5 * 4 + lVar28 * -4) * lVar7 + lVar13 * -4;
        for (; lVar21 < lVar14; lVar21 = lVar21 + 1) {
          pvVar8 = pgVar2->data;
          pvVar9 = dst->data;
          lVar37 = (long)pgVar1->data + lVar44;
          for (uVar45 = 0; uVar45 != (~((long)uVar6 >> 0x3f) & uVar6); uVar45 = uVar45 + 1) {
            lVar35 = lVar37;
            lVar38 = -lVar13;
            for (uVar23 = 0; uVar23 != (~((long)uVar4 >> 0x3f) & uVar4); uVar23 = uVar23 + 1) {
              auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
              pvVar26 = (void *)((lVar21 % lVar3) * uVar16 * uVar15 * 4 + (long)pvVar8);
              lVar34 = lVar35;
              for (uVar22 = 0; uVar22 != (~((long)uVar16 >> 0x3f) & uVar16); uVar22 = uVar22 + 1) {
                lVar43 = uVar22 * lVar42 + (uVar45 * lVar20 - lVar28);
                if (lVar43 < lVar5 && -1 < lVar43) {
                  lVar43 = 0;
                  for (uVar29 = 0; (~((long)uVar15 >> 0x3f) & uVar15) != uVar29; uVar29 = uVar29 + 1
                      ) {
                    if (lVar38 + lVar43 < lVar7 && -1 < lVar38 + lVar43) {
                      auVar11 = vfmadd231ss_fma(auVar46._0_16_,
                                                ZEXT416(*(uint *)((long)pvVar26 + uVar29 * 4)),
                                                ZEXT416(*(uint *)(lVar34 + lVar43 * 4)));
                      auVar46 = ZEXT1664(auVar11);
                    }
                    lVar43 = lVar43 + lVar41;
                  }
                }
                pvVar26 = (void *)((long)pvVar26 + uVar15 * 4);
                lVar34 = lVar34 + lVar7 * lVar42 * 4;
              }
              lVar38 = lVar38 + lVar25;
              lVar35 = lVar35 + lVar25 * 4;
              *(int *)((long)pvVar9 + uVar23 * 4 + uVar45 * uVar4 * 4 + uVar6 * uVar4 * lVar21 * 4)
                   = auVar46._0_4_;
            }
            lVar37 = lVar37 + lVar7 * lVar20 * 4;
          }
          lVar44 = lVar44 + lVar5 * lVar7 * 4;
        }
      }
      return;
    }
    pcVar24 = "dst->ne[3] == p.batch";
    uVar33 = 0x1852;
  }
  else {
    pcVar24 = "kernel->ne[3] == p.channels";
    uVar33 = 0x1851;
  }
LAB_0013ed03:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar33,"GGML_ASSERT(%s) failed",pcVar24);
}

Assistant:

void ggml_compute_forward_conv_2d_dw(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * kernel = dst->src[0];
    const ggml_tensor * src = dst->src[1];
    ggml_conv_2d_dw_params p;
    p.channels = src->ne[2];
    p.batch = src->ne[3];
    p.src_w = src->ne[0];
    p.src_h = src->ne[1];
    p.dst_w = dst->ne[0];
    p.dst_h = dst->ne[1];
    p.knl_w = kernel->ne[0];
    p.knl_h = kernel->ne[1];
    p.stride_x = dst->op_params[0];
    p.stride_y = dst->op_params[1];
    p.pad_x = dst->op_params[2];
    p.pad_y = dst->op_params[3];
    p.dilation_x = dst->op_params[4];
    p.dilation_y = dst->op_params[5];

    GGML_ASSERT(kernel->ne[3] == p.channels);
    GGML_ASSERT(dst->ne[3] == p.batch);

    if (ggml_is_contiguous(src)) {
        ggml_compute_forward_conv_2d_dw_whcn(params, src, kernel, dst, p);
    } else if (ggml_is_contiguous_channels(src)) {
        // kernel should also have channels most contiguous in memory
        GGML_ASSERT(kernel->nb[0] >= kernel->nb[2] && kernel->nb[1] >= kernel->nb[0]);
        ggml_compute_forward_conv_2d_dw_cwhn(params, src, kernel, dst, p);
    } else {
        GGML_ABORT("non-contiguous memory layout not supported");
    }
}